

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_wallmarks.cxx
# Opt level: O2

void __thiscall write_wm_data::operator()(write_wm_data *this,wm_data *wm,xr_writer *w)

{
  undefined8 in_RAX;
  float local_28;
  undefined4 local_24;
  
  local_24 = (undefined4)((ulong)in_RAX >> 0x20);
  xray_re::xr_writer::w_fvector3(w,(fvector3 *)wm);
  _local_28 = CONCAT44(local_24,(wm->bounds).r);
  (*w->_vptr_xr_writer[2])(w,&local_28,4);
  _local_28 = CONCAT44((int)(((long)(wm->vertices).
                                    super__Vector_base<xray_re::wm_vertex,_std::allocator<xray_re::wm_vertex>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(wm->vertices).
                                   super__Vector_base<xray_re::wm_vertex,_std::allocator<xray_re::wm_vertex>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x18),local_28);
  (*w->_vptr_xr_writer[2])(w,&local_24,4);
  xray_re::xr_writer::w_seq<std::vector<xray_re::wm_vertex,std::allocator<xray_re::wm_vertex>>>
            (w,&wm->vertices);
  return;
}

Assistant:

void operator()(const wm_data& wm, xr_writer& w) const {
	w.w_fvector3(wm.bounds.p);
	w.w_float(wm.bounds.r);
	w.w_size_u32(wm.vertices.size());
	w.w_seq(wm.vertices);
}